

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::init
          (DrawInvalidRangeCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  value_type vVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  int extraout_EAX;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar7;
  reference pvVar8;
  ShaderProgram *this_00;
  ProgramSources *pPVar9;
  TestLog *log;
  TestError *this_01;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d2;
  allocator<char> local_1d1;
  string local_1d0;
  ShaderSource local_1b0;
  allocator<char> local_181;
  string local_180;
  ShaderSource local_160;
  ProgramSources local_138;
  value_type local_68;
  allocator<unsigned_int> local_61;
  int ndx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  allocator<tcu::Vector<float,_4>_> local_31;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Functions *gl;
  DrawInvalidRangeCase *this_local;
  
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
  iVar4 = this->m_bufferedElements;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_31);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             (long)iVar4,&local_31);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_31);
  iVar4 = this->m_numIndices;
  std::allocator<unsigned_int>::allocator(&local_61);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx,(long)iVar4,&local_61);
  std::allocator<unsigned_int>::~allocator(&local_61);
  for (local_68 = 0; vVar2 = local_68, (int)local_68 < this->m_numIndices; local_68 = local_68 + 1)
  {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx,
                        (long)(int)local_68);
    *pvVar7 = vVar2;
  }
  (**(code **)(data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[0x6c].m_data + 2))
            (1,&this->m_buffer);
  (**(code **)data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[4].m_data)(0x8892,this->m_buffer);
  pcVar1 = *(code **)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].m_data;
  iVar4 = this->m_bufferedElements;
  pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30,0);
  (*pcVar1)(0x8892,(long)(iVar4 << 4),pvVar8,0x88e4);
  dVar5 = (**(code **)data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[0x80].m_data)();
  glu::checkError(dVar5,"buffer gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0x78);
  (**(code **)(data.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage[0x6c].m_data + 2))
            (1,&this->m_indexBuffer);
  (**(code **)data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[4].m_data)
            (0x8893,this->m_indexBuffer);
  pcVar1 = *(code **)data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[0x15].m_data;
  iVar4 = this->m_numIndices;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx,0);
  (*pcVar1)(0x8893,(long)(iVar4 << 2),pvVar7,0x88e4);
  dVar5 = (**(code **)data.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[0x80].m_data)();
  glu::checkError(dVar5,"buffer gen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0x7d);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  local_1d2 = 1;
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_181);
  glu::VertexSource::VertexSource((VertexSource *)&local_160,&local_180);
  pPVar9 = glu::ProgramSources::operator<<(&local_138,&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,&local_1d1);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1b0,&local_1d0);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_1b0);
  glu::ShaderProgram::ShaderProgram(this_00,pRVar6,pPVar9);
  local_1d2 = 0;
  this->m_program = this_00;
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  glu::VertexSource::~VertexSource((VertexSource *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  glu::ProgramSources::~ProgramSources(&local_138);
  bVar3 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar3) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,"could not build program",&local_1f9);
    tcu::TestError::TestError(this_01,&local_1f8);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  return extraout_EAX;
}

Assistant:

void DrawInvalidRangeCase::init (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	std::vector<tcu::Vec4>	data	(m_bufferedElements); // !< some junk data to make sure buffer is really allocated
	std::vector<deUint32>	indices	(m_numIndices);

	for (int ndx = 0; ndx < m_numIndices; ++ndx)
		indices[ndx] = ndx;

	gl.genBuffers(1, &m_buffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.bufferData(GL_ARRAY_BUFFER, int(m_bufferedElements * sizeof(tcu::Vec4)), &data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

	gl.genBuffers(1, &m_indexBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);
	gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, int(m_numIndices * sizeof(deUint32)), &indices[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "buffer gen");

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(s_vertexSource) << glu::FragmentSource(s_fragmentSource));
	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		throw tcu::TestError("could not build program");
	}
}